

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelMappingSparse.cpp
# Opt level: O0

void __thiscall
TransitionModelMappingSparse::TransitionModelMappingSparse
          (TransitionModelMappingSparse *this,int nrS,int nrJA)

{
  int in_EDX;
  TransitionModelDiscrete *in_RDI;
  int a;
  SparseMatrix *T;
  size_type in_stack_00000048;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_00000050;
  undefined8 in_stack_ffffffffffffffb8;
  TransitionModelDiscrete *__x;
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_ffffffffffffffd0;
  int local_1c;
  
  TransitionModelDiscrete::TransitionModelDiscrete
            (in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  (in_RDI->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel =
       (_func_int **)&PTR__TransitionModelMappingSparse_00d4cff8;
  __x = in_RDI + 1;
  std::
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::vector((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)0xb010f9);
  for (local_1c = 0; local_1c != in_EDX; local_1c = local_1c + 1) {
    operator_new(0x70);
    boost::numeric::ublas::
    compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::compressed_matrix(in_stack_00000050,in_stack_00000048,(size_type)this,CONCAT44(nrS,nrJA));
    std::
    vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::push_back(in_stack_ffffffffffffffd0,(value_type *)__x);
  }
  return;
}

Assistant:

TransitionModelMappingSparse::TransitionModelMappingSparse(int nrS, int nrJA) :
    TransitionModelDiscrete(nrS, nrJA)
{    
    SparseMatrix *T;
    for(int a=0;a!=nrJA;++a)
    {
        T=new SparseMatrix(nrS,nrS);
        _m_T.push_back(T);
    }
}